

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fec-group.c
# Opt level: O3

int fec_group_decode(fec_group_t *group)

{
  byte bVar1;
  ushort uVar2;
  uint *puVar3;
  gf *pkts;
  long lVar4;
  int iVar5;
  fec_t *fec;
  ulong uVar6;
  uint uVar7;
  undefined8 uStack_30;
  
  if (group == (fec_group_t *)0x0) {
    uStack_30 = 0x106bee;
    __assert_fail("group != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/fec-group.c",0x88,
                  "int fec_group_decode(fec_group_t *)");
  }
  uVar7 = 1;
  if (group->decoded == 0) {
    uVar7 = 0;
    if (group->fec_k <= group->rcvd_pkts) {
      lVar4 = -(ulong)((uint)group->fec_k * 4 + 0xf & 0xfffffff0);
      bVar1 = group->fec_n;
      if (bVar1 == 0) {
        uVar7 = 0;
      }
      else {
        puVar3 = group->lengths;
        uVar6 = 0;
        uVar7 = 0;
        do {
          if (puVar3[uVar6] != 0) {
            *(uint *)((long)(&stack0xffffffffffffffd8 + lVar4) + (long)(int)uVar7 * 4) = (uint)uVar6
            ;
            uVar7 = uVar7 + 1;
            if (uVar7 == group->fec_k) break;
          }
          uVar6 = uVar6 + 1;
        } while ((uint)bVar1 != uVar6);
      }
      if (uVar7 != group->fec_k) {
        *(undefined8 *)((long)&uStack_30 + lVar4) = 0x106c0d;
        __assert_fail("j == group->fec_k",
                      "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/fec-group.c",
                      0x9f,"int fec_group_decode(fec_group_t *)");
      }
      *(undefined8 *)((long)&uStack_30 + lVar4) = 0x106b7f;
      fec = fec_new(uVar7,(uint)bVar1);
      if (fec == (fec_t *)0x0) {
        *(code **)((long)&uStack_30 + lVar4) = fec_group_decode_to_adus;
        __assert_fail("fec != NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/fec-group.c",
                      0xa3,"int fec_group_decode(fec_group_t *)");
      }
      pkts = group->buf;
      uVar2 = group->fec_len;
      *(undefined8 *)((long)&uStack_30 + lVar4) = 0x106b9e;
      iVar5 = fec_decode(fec,pkts,(uint *)(&stack0xffffffffffffffd8 + lVar4),(uint)uVar2);
      if (iVar5 == 0) {
        *(undefined8 *)((long)&uStack_30 + lVar4) = 0x106bcb;
        fec_group_decode_cold_1();
      }
      else {
        *(undefined8 *)((long)&uStack_30 + lVar4) = 0x106baa;
        fec_free(fec);
        group->decoded = 1;
      }
      uVar7 = (uint)(iVar5 != 0);
    }
  }
  return uVar7;
}

Assistant:

int fec_group_decode(fec_group_t *group) {
  assert(group != NULL);
  
  if (group->decoded)
    return 1;
  
  /* check if enough packets in the group have been received to
   * recover the complete source data.
   */
  if (group->rcvd_pkts >= group->fec_k) {
    /* we have enough packets in the fec group */
    unsigned int idxs[group->fec_k];

    /* create index array and pointer array. */
    int i, j;
    for (i = 0, j = 0; i < group->fec_n; i++) {
      if (group->lengths[i] > 0) {
        idxs[j] = i;
        j++;
        if (j == group->fec_k)
          break;
      }
    }

    assert(j == group->fec_k);

    /* create the fec structure. */
    fec_t *fec = fec_new(group->fec_k, group->fec_n);
    assert(fec != NULL);

    /* decode the fec group. */
    if (!fec_decode(fec, group->buf, idxs, group->fec_len)) {
      fprintf(stderr, "Could not decode FEC group\n");
      fec_free(fec);
      return 0;
    }

    fec_free(fec);

    group->decoded = 1;

    return 1;
  }  else {
    return 0;
  }
}